

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_postprocess.cpp
# Opt level: O0

void __thiscall FGLRenderer::BindTonemapPalette(FGLRenderer *this,int texunit)

{
  undefined1 uVar1;
  uint uVar2;
  uchar *puVar3;
  FHardwareTexture *pFVar4;
  FString local_50;
  int local_48;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_44;
  int index;
  PalEntry color;
  int b;
  int g;
  int r;
  undefined1 local_28 [8];
  TArray<unsigned_char,_unsigned_char> lut;
  int texunit_local;
  FGLRenderer *this_local;
  
  lut.Count = texunit;
  if (this->mTonemapPalette == (FHardwareTexture *)0x0) {
    TArray<unsigned_char,_unsigned_char>::TArray((TArray<unsigned_char,_unsigned_char> *)local_28);
    TArray<unsigned_char,_unsigned_char>::Resize
              ((TArray<unsigned_char,_unsigned_char> *)local_28,0x100000);
    for (b = 0; b < 0x40; b = b + 1) {
      for (color.field_0 =
                (anon_union_4_2_12391d7c_for_PalEntry_0)
                (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)0x0;
          (int)color.field_0 < 0x40;
          color.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)((int)color.field_0 + 1)) {
        for (index = 0; index < 0x40; index = index + 1) {
          uVar2 = PTM_BestColor(this,(uint32 *)&GPalette,b << 2 | b >> 4,
                                (int)color.field_0 << 2 | (int)color.field_0 >> 4,
                                index << 2 | index >> 4,0,0x100);
          local_44 = (anon_union_4_2_12391d7c_for_PalEntry_0)
                     *(anon_union_4_2_12391d7c_for_PalEntry_0 *)
                      &GPalette.BaseColors[uVar2 & 0xff].field_0.field_0;
          local_48 = ((b * 0x40 + (int)color.field_0) * 0x40 + index) * 4;
          uVar1 = local_44._2_1_;
          puVar3 = TArray<unsigned_char,_unsigned_char>::operator[]
                             ((TArray<unsigned_char,_unsigned_char> *)local_28,(long)local_48);
          *puVar3 = uVar1;
          uVar1 = local_44._1_1_;
          puVar3 = TArray<unsigned_char,_unsigned_char>::operator[]
                             ((TArray<unsigned_char,_unsigned_char> *)local_28,(long)(local_48 + 1))
          ;
          *puVar3 = uVar1;
          uVar1 = local_44._0_1_;
          puVar3 = TArray<unsigned_char,_unsigned_char>::operator[]
                             ((TArray<unsigned_char,_unsigned_char> *)local_28,(long)(local_48 + 2))
          ;
          *puVar3 = uVar1;
          puVar3 = TArray<unsigned_char,_unsigned_char>::operator[]
                             ((TArray<unsigned_char,_unsigned_char> *)local_28,(long)(local_48 + 3))
          ;
          *puVar3 = 0xff;
        }
      }
    }
    pFVar4 = (FHardwareTexture *)operator_new(0x30);
    FHardwareTexture::FHardwareTexture(pFVar4,0x200,0x200,true);
    this->mTonemapPalette = pFVar4;
    pFVar4 = this->mTonemapPalette;
    puVar3 = TArray<unsigned_char,_unsigned_char>::operator[]
                       ((TArray<unsigned_char,_unsigned_char> *)local_28,0);
    uVar2 = lut.Count;
    FString::FString(&local_50,"mTonemapPalette");
    FHardwareTexture::CreateTexture(pFVar4,puVar3,0x200,0x200,uVar2,false,0,&local_50);
    FString::~FString(&local_50);
    (*_ptrc_glActiveTexture)(lut.Count + 0x84c0);
    (*_ptrc_glTexParameteri)(0xde1,0x2801,0x2600);
    (*_ptrc_glTexParameteri)(0xde1,0x2800,0x2600);
    (*_ptrc_glTexParameteri)(0xde1,0x2802,0x812f);
    (*_ptrc_glTexParameteri)(0xde1,0x2803,0x812f);
    (*_ptrc_glActiveTexture)(0x84c0);
    TArray<unsigned_char,_unsigned_char>::~TArray((TArray<unsigned_char,_unsigned_char> *)local_28);
  }
  else {
    FHardwareTexture::Bind(this->mTonemapPalette,texunit,0,false);
  }
  return;
}

Assistant:

void FGLRenderer::BindTonemapPalette(int texunit)
{
	if (mTonemapPalette)
	{
		mTonemapPalette->Bind(texunit, 0, false);
	}
	else
	{
		TArray<unsigned char> lut;
		lut.Resize(512 * 512 * 4);
		for (int r = 0; r < 64; r++)
		{
			for (int g = 0; g < 64; g++)
			{
				for (int b = 0; b < 64; b++)
				{
					PalEntry color = GPalette.BaseColors[(BYTE)PTM_BestColor((uint32 *)GPalette.BaseColors, (r << 2) | (r >> 4), (g << 2) | (g >> 4), (b << 2) | (b >> 4), 0, 256)];
					int index = ((r * 64 + g) * 64 + b) * 4;
					lut[index] = color.r;
					lut[index + 1] = color.g;
					lut[index + 2] = color.b;
					lut[index + 3] = 255;
				}
			}
		}

		mTonemapPalette = new FHardwareTexture(512, 512, true);
		mTonemapPalette->CreateTexture(&lut[0], 512, 512, texunit, false, 0, "mTonemapPalette");

		glActiveTexture(GL_TEXTURE0 + texunit);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glActiveTexture(GL_TEXTURE0);
	}
}